

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O0

bool __thiscall spvtools::opt::LoopDescriptor::CreatePreHeaderBlocksIfMissing(LoopDescriptor *this)

{
  bool bVar1;
  reference this_00;
  BasicBlock *pBVar2;
  Loop *loop;
  iterator __end2;
  iterator __begin2;
  LoopDescriptor *__range2;
  bool modified;
  LoopDescriptor *this_local;
  
  __range2._7_1_ = false;
  begin((iterator *)
        ((long)&__end2.parent_iterators_.c.
                super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish + 0x18),this);
  end((iterator *)&loop,this);
  while( true ) {
    bVar1 = PostOrderTreeDFIterator<spvtools::opt::Loop>::operator!=
                      ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)
                       ((long)&__end2.parent_iterators_.c.
                               super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                               ._M_impl.super__Deque_impl_data._M_finish + 0x18),
                       (PostOrderTreeDFIterator<spvtools::opt::Loop> *)&loop);
    if (!bVar1) break;
    this_00 = PostOrderTreeDFIterator<spvtools::opt::Loop>::operator*
                        ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)
                         ((long)&__end2.parent_iterators_.c.
                                 super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                                 ._M_impl.super__Deque_impl_data._M_finish + 0x18));
    pBVar2 = Loop::GetPreHeaderBlock(this_00);
    if (pBVar2 == (BasicBlock *)0x0) {
      __range2._7_1_ = true;
      Loop::GetOrCreatePreHeaderBlock(this_00);
    }
    PostOrderTreeDFIterator<spvtools::opt::Loop>::operator++
              ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)
               ((long)&__end2.parent_iterators_.c.
                       super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  }
  PostOrderTreeDFIterator<spvtools::opt::Loop>::~PostOrderTreeDFIterator
            ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)&loop);
  PostOrderTreeDFIterator<spvtools::opt::Loop>::~PostOrderTreeDFIterator
            ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)
             ((long)&__end2.parent_iterators_.c.
                     super__Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  return __range2._7_1_;
}

Assistant:

bool LoopDescriptor::CreatePreHeaderBlocksIfMissing() {
  auto modified = false;

  for (auto& loop : *this) {
    if (!loop.GetPreHeaderBlock()) {
      modified = true;
      // TODO(1841): Handle failure to create pre-header.
      loop.GetOrCreatePreHeaderBlock();
    }
  }

  return modified;
}